

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureWeight::ByteSizeLong
          (BayesianProbitRegressor_FeatureWeight *this)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  reference value;
  size_t sVar4;
  long lVar5;
  int cached_size;
  BayesianProbitRegressor_FeatureValueWeight *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight> *__range2;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  BayesianProbitRegressor_FeatureWeight *this_local;
  
  iVar2 = _internal_weights_size(this);
  sStack_18 = (size_t)iVar2;
  __end2 = google::protobuf::
           RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>::
           begin(&this->weights_);
  msg = (BayesianProbitRegressor_FeatureValueWeight *)
        google::protobuf::
        RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>::end
                  (&this->weights_);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>
                 ::operator!=(&__end2,(iterator *)&msg), bVar1) {
    value = google::protobuf::internal::
            RepeatedPtrIterator<const_CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>
            ::operator*(&__end2);
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>(value);
    sStack_18 = sVar4 + sStack_18;
    google::protobuf::internal::
    RepeatedPtrIterator<const_CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>::
    operator++(&__end2);
  }
  uVar3 = _internal_featureid(this);
  if (uVar3 != 0) {
    uVar3 = _internal_featureid(this);
    sVar4 = google::protobuf::internal::WireFormatLite::UInt32SizePlusOne(uVar3);
    sStack_18 = sVar4 + sStack_18;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar5 = std::__cxx11::string::size();
    sStack_18 = lVar5 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  SetCachedSize(this,iVar2);
  return sStack_18;
}

Assistant:

size_t BayesianProbitRegressor_FeatureWeight::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BayesianProbitRegressor.FeatureWeight)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight weights = 2;
  total_size += 1UL * this->_internal_weights_size();
  for (const auto& msg : this->weights_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // uint32 featureId = 1;
  if (this->_internal_featureid() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt32SizePlusOne(this->_internal_featureid());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}